

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int forkal(int ip,int iq,int id,double *phi,double *theta,double *delta,int N,double *W,
          double *resid,int il,double *Y,double *AMSE)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int local_1b8;
  int jrk;
  int j1;
  int jrj;
  int ind2;
  int ind1;
  int kkk;
  int kk;
  int k1;
  int kk1;
  int iri;
  int jklj;
  int lk1;
  int lk;
  int jj;
  int iri1;
  int l;
  int ibc;
  int id2r2;
  int jkl1;
  int jkl;
  int iddr;
  int idrr1;
  int i45;
  int idd2;
  int idd1;
  int id1;
  int id2r1;
  int id2r;
  int ir1;
  int ir2;
  int irj;
  int ind;
  int iter;
  int nit;
  int iupd;
  int iid;
  int idk;
  int nj;
  int nt;
  int ll;
  int j;
  int i;
  double AMS;
  double phii;
  double phijdt;
  double phij;
  double dt;
  double A1;
  double sigma;
  double ssq;
  double sumlog;
  double del;
  double AA;
  double two;
  double one;
  double zero;
  double *xrow;
  double *store;
  double *V;
  double *P;
  double *A;
  int local_70;
  int irz;
  int ird;
  int nrbar;
  int k;
  int np;
  int ir;
  int ifault;
  double *delta_local;
  double *theta_local;
  double *phi_local;
  int id_local;
  int iq_local;
  int ip_local;
  
  k = iq + 1;
  if (k < ip) {
    k = ip;
  }
  nrbar = (k * (k + 1)) / 2;
  irz = (nrbar * (nrbar + -1)) / 2;
  local_70 = k + id;
  A._4_4_ = (local_70 * (local_70 + 1)) / 2;
  one = 0.0;
  two = 1.0;
  AA = 2.0;
  np = (int)(ip < 0);
  if (iq < 0) {
    np = np + 2;
  }
  if (ip * ip + iq * iq == 0) {
    np = 4;
  }
  if (id < 0) {
    np = 8;
  }
  if (il < 1) {
    np = 0xb;
  }
  if (np == 0) {
    _ir = delta;
    delta_local = theta;
    theta_local = phi;
    phi_local._0_4_ = id;
    phi_local._4_4_ = iq;
    id_local = ip;
    P = (double *)malloc((long)local_70 << 3);
    V = (double *)malloc((long)A._4_4_ << 3);
    store = (double *)malloc((long)nrbar << 3);
    xrow = (double *)malloc((long)local_70 << 3);
    zero = (double)malloc((long)nrbar << 3);
    for (ll = 0; ll < local_70; ll = ll + 1) {
      P[ll] = one;
      xrow[ll] = one;
    }
    for (ll = 0; ll < A._4_4_; ll = ll + 1) {
      V[ll] = one;
    }
    for (ll = 0; ll < nrbar; ll = ll + 1) {
      store[ll] = one;
      *(double *)((long)zero + (long)ll * 8) = one;
    }
    *P = one;
    *store = two;
    if (k == 1) {
      *V = 1.0 / (-*theta_local * *theta_local + 1.0);
    }
    else {
      starma(id_local,phi_local._4_4_,theta_local,delta_local,P,V,store);
    }
    idk = N - (int)phi_local;
    if ((int)phi_local != 0) {
      for (nt = 1; nt <= (int)phi_local; nt = nt + 1) {
        iid = N - nt;
        xrow[nt + -1] = W[iid + -1];
      }
      for (ll = 1; ll <= idk; ll = ll + 1) {
        del = one;
        for (ird = 1; ird <= (int)phi_local; ird = ird + 1) {
          iupd = ((int)phi_local + ll) - ird;
          del = -_ir[ird + -1] * W[iupd + -1] + del;
        }
        nit = ll + (int)phi_local;
        W[ll + -1] = W[nit + -1] + del;
      }
    }
    sigma = one;
    ssq = one;
    sumlog = -1.0;
    iter = 1;
    ind = 0;
    irj = 0;
    karma(id_local,phi_local._4_4_,theta_local,delta_local,P,V,store,idk,W,resid,&ssq,&sigma,1,-1.0,
          &irj,&ind);
    iVar1 = k;
    A1 = one;
    for (nt = 0; nt < idk; nt = nt + 1) {
      A1 = resid[nt] * resid[nt] + A1;
    }
    A1 = A1 / (double)idk;
    if ((int)phi_local != 0) {
      for (ll = 1; ll <= nrbar; ll = ll + 1) {
        *(double *)((long)zero + (long)(ll + -1) * 8) = V[ll + -1];
      }
      for (ll = 1; ll <= A._4_4_; ll = ll + 1) {
        V[ll + -1] = one;
      }
      ir2 = 0;
      for (nt = 1; nt <= k; nt = nt + 1) {
        ird = (nt + -1) * ((int)phi_local + k + 1) - ((nt + -1) * nt) / 2;
        for (ll = nt; ll <= k; ll = ll + 1) {
          V[ird] = *(double *)((long)zero + (long)ir2 * 8);
          ir2 = ir2 + 1;
          ird = ird + 1;
        }
      }
      for (nt = 1; nt <= (int)phi_local; nt = nt + 1) {
        P[k + nt + -1] = xrow[nt + -1];
      }
    }
    iVar2 = k + -1;
    iVar3 = (int)phi_local + -1;
    iVar4 = local_70 * 2;
    iVar5 = (int)phi_local * 2;
    iVar6 = iVar5 + 2;
    iVar7 = iVar4 + 1;
    iVar8 = local_70 + 1;
    iVar9 = (k * ((int)phi_local * 2 + k + 1)) / 2;
    iVar10 = (k * (iVar7 - k)) / 2;
    for (jj = 1; jj <= il; jj = jj + 1) {
      dt = *P;
      if (k != 1) {
        for (ll = 1; ll <= iVar2; ll = ll + 1) {
          P[ll + -1] = P[ll];
        }
      }
      P[k + -1] = one;
      if (id_local != 0) {
        for (nt = 1; nt <= id_local; nt = nt + 1) {
          P[nt + -1] = theta_local[nt + -1] * dt + P[nt + -1];
        }
      }
      if ((int)phi_local != 0) {
        for (nt = 1; nt <= (int)phi_local; nt = nt + 1) {
          dt = _ir[nt + -1] * P[k + nt + -1] + dt;
        }
        if (1 < (int)phi_local) {
          for (ll = 1; ll <= iVar3; ll = ll + 1) {
            P[local_70 - ll] = P[(local_70 - ll) + -1];
          }
        }
        P[iVar1] = dt;
      }
      if ((int)phi_local != 0) {
        for (ll = 1; ll <= (int)phi_local; ll = ll + 1) {
          xrow[ll + -1] = one;
          for (nt = 1; nt <= (int)phi_local; nt = nt + 1) {
            nj = imax(ll,nt);
            ird = imin(ll,nt);
            xrow[ll + -1] =
                 _ir[nt + -1] * V[iVar9 + (nj - ird) + ((ird + -1) * (iVar6 - ird)) / 2] +
                 xrow[ll + -1];
          }
        }
        if ((int)phi_local != 1) {
          for (nt = 1; nt <= iVar3; nt = nt + 1) {
            iVar11 = (int)phi_local - nt;
            iri = (iVar11 * ((iVar5 + 1) - iVar11)) / 2 + iVar9;
            jklj = ((iVar11 + -1) * (iVar6 - iVar11)) / 2 + iVar9;
            for (ll = 1; ll <= nt; ll = ll + 1) {
              V[iri] = V[jklj];
              iri = iri + 1;
              jklj = jklj + 1;
            }
          }
          for (nt = 1; nt <= iVar3; nt = nt + 1) {
            V[iVar9 + nt] = xrow[nt + -1] + V[k + nt + -1];
          }
        }
        V[iVar9] = *V;
        for (ll = 1; ll <= (int)phi_local; ll = ll + 1) {
          V[iVar9] = _ir[ll + -1] * (AA * V[k + ll + -1] + xrow[ll + -1]) + V[iVar9];
        }
        for (ll = 1; ll <= (int)phi_local; ll = ll + 1) {
          xrow[ll + -1] = V[k + ll + -1];
        }
        for (nt = 1; nt <= k; nt = nt + 1) {
          for (ll = 1; ll <= (int)phi_local; ll = ll + 1) {
            ird = ((nt + -1) * (iVar4 - nt)) / 2 + k + ll;
            V[ird + -1] = theta_local[nt + -1] * xrow[ll + -1];
            if (nt != k) {
              V[ird + -1] = V[(nt * ((iVar4 + -1) - nt)) / 2 + k + ll + -1] + V[ird + -1];
            }
          }
        }
        for (nt = 1; nt <= k; nt = nt + 1) {
          xrow[nt + -1] = one;
          ind2 = (nt * (iVar7 - nt)) / 2 - (int)phi_local;
          for (ll = 1; ll <= (int)phi_local; ll = ll + 1) {
            xrow[nt + -1] = _ir[ll + -1] * V[ind2] + xrow[nt + -1];
            ind2 = ind2 + 1;
          }
        }
        if ((int)phi_local != 1) {
          for (nt = 1; nt <= k; nt = nt + 1) {
            ird = (nt * iVar8 - (nt * (nt + 1)) / 2) + 1;
            for (ll = 1; ll <= iVar3; ll = ll + 1) {
              V[ird + -2] = V[ird + -3];
              ird = ird + -1;
            }
          }
        }
        for (nt = 1; nt <= k; nt = nt + 1) {
          iVar11 = ((nt + -1) * (iVar4 - nt)) / 2 + k;
          ird = iVar11 + 1;
          V[iVar11] = theta_local[nt + -1] * *V + xrow[nt + -1];
          if (nt < k) {
            V[iVar11] = V[nt] + V[iVar11];
          }
        }
      }
      for (ll = 0; ll < k; ll = ll + 1) {
        xrow[ll] = V[ll];
      }
      ir2 = 0;
      phij = *V;
      for (nt = 1; nt <= k; nt = nt + 1) {
        phijdt = theta_local[nt + -1];
        phii = phijdt * phij;
        jrj = (nt * (iVar7 - nt)) / 2;
        j1 = ((nt + -1) * ((iVar4 + 2) - nt)) / 2;
        for (ll = nt; ll <= k; ll = ll + 1) {
          AMS = theta_local[ll + -1];
          V[j1] = AMS * phii + store[ir2];
          if (nt < k) {
            V[j1] = xrow[nt] * AMS + V[j1];
          }
          if (ll != k) {
            V[j1] = xrow[ll] * phijdt + V[jrj] + V[j1];
            jrj = jrj + 1;
          }
          j1 = j1 + 1;
          ir2 = ir2 + 1;
        }
      }
      Y[jj + -1] = *P;
      if ((int)phi_local != 0) {
        for (nt = 1; nt <= (int)phi_local; nt = nt + 1) {
          Y[jj + -1] = P[k + nt + -1] * _ir[nt + -1] + Y[jj + -1];
        }
      }
      _j = *V;
      if ((int)phi_local != 0) {
        for (nt = 1; nt <= (int)phi_local; nt = nt + 1) {
          _j = AA * _ir[nt + -1] * V[k + nt + -1] +
               V[iVar10 + ((nt + -1) * (iVar6 - nt)) / 2] * _ir[nt + -1] * _ir[nt + -1] + _j;
        }
        if ((int)phi_local != 1) {
          for (nt = 1; nt <= iVar3; nt = nt + 1) {
            local_1b8 = iVar10 + 1 + ((nt + -1) * (iVar6 - nt)) / 2;
            iVar11 = nt;
            while (ll = iVar11 + 1, ll <= (int)phi_local) {
              _j = AA * _ir[iVar11] * _ir[nt + -1] * V[local_1b8] + _j;
              local_1b8 = local_1b8 + 1;
              iVar11 = ll;
            }
          }
        }
      }
      AMSE[jj + -1] = _j * A1;
    }
    free(P);
    free(V);
    free(store);
    free(xrow);
    free((void *)zero);
    iq_local = np;
  }
  else {
    iq_local = np;
  }
  return iq_local;
}

Assistant:

int forkal(int ip,int iq,int id,double *phi,double*theta,double *delta,int N,double *W,double *resid,int il,double *Y,double *AMSE) {
	int ifault,ir,np,k,nrbar,ird,irz;
	double *A,*P,*V,*store,*xrow;
	double zero, one, two,AA,del,sumlog,ssq,sigma,A1,dt,phij,phijdt,phii,AMS;
	int i,  j, ll, nt, nj, idk, iid,iupd,nit,iter,ind,irj;
	int ir2, ir1, id2r, id2r1, id1,idd1,idd2,i45,idrr1,iddr,jkl,jkl1,id2r2,ibc,l,iri1,jj;
	int lk, lk1,jklj,iri,kk1,k1,kk,kkk,ind1,ind2,jrj,j1,jrk;
	/*
C     C Translation of Fortran routine
C     ALGORITHM AS 182  APPL. STATIST. (1982) VOL.31, NO.2
C
C     Finite sample prediction from ARIMA processes.
C
C     Auxiliary routines required: KARMA & STARMA from AS 154 and
C     routines called by them: INCLU2 from ASR 17 (a slight variant on
C     AS 75, and REGRES from AS 75.
C*/
	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}
	np = (ir * (ir + 1)) / 2;
	nrbar = (np * (np - 1)) / 2;
	ird = ir + id;
	irz = (ird * (ird + 1)) / 2;
	zero = 0.0;
	one = 1.0;
	two = 2.0;

	ifault = 0;

	if (ip < 0) {
		ifault = 1;
	}
	if (iq < 0) {
		ifault = ifault + 2;
	}
	if (ip*ip + iq*iq == 0) {
		ifault = 4;
	}
	if (id < 0) {
		ifault = 8;
	}
	if (il < 1) {
		ifault = 11;
	}
	if (ifault != 0) {
		return ifault;
	}

	A = (double*)malloc(sizeof(double)* ird);
	P = (double*)malloc(sizeof(double)* irz);
	V = (double*)malloc(sizeof(double)* np); 
	store = (double*)malloc(sizeof(double)* ird);
	xrow = (double*)malloc(sizeof(double)* np);

	//Initial Conditions for Kalman Filter

	for (i = 0; i < ird; ++i) {
		A[i] = zero;
		store[i] = zero;
	}
	for (i = 0; i < irz; ++i) {
		P[i] = zero;
	}
	for (i = 0; i < np; ++i) {
		V[i] = zero;
		xrow[i] = zero;
	}
	A[0] = zero;
	V[0] = one;
	/*

	if (np != 1) {
		for (i = 2; i <= np; ++i) {
			V[i-1] = zero;
		}
		if (iq != 0) {
			iq1 = iq + 1;
			for (i = 2; i <= iq1; ++i) {
				V[i-1] = theta[i - 2];
			}
			for (j = 1; j <= iq; ++j) {
				ll = j * (2 * ir + 1 - j) / 2;
				for (i = j; i <= iq; ++i) {
					lli = ll + i;
					V[lli-1] = theta[i-1] * theta[j-1]; // Error
				}
			}
		}
	}//130
*/
	//Find initial likelihood conditions.

	if (ir == 1) {
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		starma(ip, iq, phi, theta,A, P, V);
	}

	//Calculate Data Transformations

	nt = N - id;

	if (id != 0) {
		for (j = 1; j <= id; ++j) {
			nj = N - j;
			store[j-1] = W[nj-1];
		}
		for (i = 1; i <= nt; ++i) {
			AA = zero;
			for (k = 1; k <= id; ++k) {
				idk = id + i - k;
				AA -= delta[k - 1] * W[idk - 1];
			}
			iid = i + id;
			W[i - 1] = W[iid - 1] + AA;
		}
	}//170

	//Evaluate likelihood to obtain final KF conditions
	sumlog = ssq = zero;
	del = -1.0;
	iupd = 1;
	nit = 0;
	iter = 0;

	karma(ip, iq, phi, theta, A, P, V, nt, W, resid, &sumlog, &ssq, iupd, del,&iter, &nit);

	//Calculate M.L.E. of sigma squared

	sigma = zero;

	for (j = 0; j < nt; ++j) {
		sigma += resid[j] * resid[j];
	}
	sigma = sigma / nt;
	//mdisplay(resid, 1, N);

	//Reset the initial A and P when differencing occurs

	if (id != 0) {
		for (i = 1; i <= np; ++i) {
			xrow[i-1] = P[i-1];
		}
		for (i = 1; i <= irz; ++i) {
			P[i-1] = zero;
		}
		ind = 0;
		for (j = 1; j <= ir; ++j) {
			k = (j - 1) * (id + ir + 1) - (j - 1) * j / 2;
			for (i = j; i <= ir; ++i) {
				ind++;
				k++;
				P[k - 1] = xrow[ind-1];
			}
		}

		for (j = 1; j <= id; ++j) {
			irj = ir + j;
			A[irj-1] = store[j-1];
		}

	}//250

	//Set up constants
	ir2 = ir + 1;
	ir1 = ir - 1;
	id1 = id - 1;
	id2r = 2 * ird;
	id2r1 = id2r - 1;
	idd1 = 2 * id + 1;
	idd2 = idd1 + 1;
	i45 = id2r + 1;
	idrr1 = ird + 1;
	iddr = 2 * id + ir;
	jkl = ir * (iddr + 1) / 2;
	jkl1 = jkl + 1;
	id2r2 = id2r + 2;
	ibc = ir * (i45 - ir) / 2;

	for (l = 1; l <= il; ++l) {
		//Predict A
		A1 = A[0];
		if (ir != 1) {
			for (i = 1; i <= ir1; ++i) {
				A[i-1] = A[i];
			}
		}//310
		A[ir-1] = zero;
		if (ip != 0) {
			for (j = 1; j <= ip; ++j) {
				A[j-1] += phi[j-1] * A1;
			}
		}//330
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				irj = ir + j;
				A1 += delta[j-1] * A[irj-1];
			}//340
			if (id >= 2) {
				for (i = 1; i <= id1; ++i) {
					iri1 = ird - i;
					A[iri1] = A[iri1-1];
				}
			}//360
			A[ir2 - 1] = A1;
		}//360

		//A[ir2-1] = A1;

		//Predict P

		if (id != 0) {
			for (i = 1; i <= id; ++i) {
				store[i-1] = zero;
				for (j = 1; j <= id; ++j) {
					ll = imax(i, j);
					k = imin(i, j);
					jj = jkl + (ll - k) + 1 + (k - 1) * (idd2 - k) / 2;
					store[i-1] += delta[j-1] * P[jj-1];
				}
			}//370

			if (id != 1) {
				for (j = 1; j <= id1; ++j) {
					jj = id - j;
					lk = (jj - 1) * (idd2 - jj) / 2 + jkl;
					lk1 = jj * (idd1 - jj) / 2 + jkl;
					for (i = 1; i <= j; ++i) {
						lk = lk + 1;
						lk1 = lk1 + 1;
						P[lk1-1] = P[lk-1];
					}
				}//380
				for (j = 1; j <= id1; ++j) {
					jklj = jkl1 + j;
					irj = ir + j;
					P[jklj - 1] = store[j - 1] + P[irj-1];
				}
			}//400

			P[jkl1 - 1] = P[0];

			for (i = 1; i <= id; ++i) {
				iri = ir + i;
				P[jkl1 - 1] += delta[i - 1] * (store[i - 1] + two * P[iri - 1]);
			}

			for (i = 1; i <= id; ++i) {
				iri = ir + i;
				store[i - 1] = P[iri - 1];
			}

			for (j = 1; j <= ir; ++j) {
				kk1 = j * (id2r1 - j) / 2 + ir;
				k1 = (j - 1) * (id2r - j) / 2 + ir;
				for (i = 1; i <= id; ++i) {
					kk = kk1 + i;
					k = k1 + i;
					P[k - 1] = phi[j - 1] * store[i - 1];
					if (j != ir) {
						P[k - 1] += P[kk - 1];
					}
				}
			}

			for (j = 1; j <= ir; ++j) {
				store[j - 1] = zero;
				kkk = j * (i45 - j) / 2 - id;
				for (i = 1; i <= id; ++i) {
					kkk++;
					store[j - 1] += delta[i - 1] * P[kkk - 1];
				}
			}//440

			if (id != 1) {
				for (j = 1; j <= ir; ++j) {
					k = j * idrr1 - j * (j + 1) / 2 + 1;
					for (i = 1; i <= id1; ++i) {
						k--;
						P[k - 1] = P[k - 2];
					}
				}
			}//460

			for (j = 1; j <= ir; ++j) {
				k = (j - 1) * (id2r - j) / 2 + ir + 1;
				P[k - 1] = store[j - 1] + phi[j - 1] * P[0];
				if (j < ir) {
					P[k - 1] += P[j];
				}
			}

		}//480

		for (i = 0; i < ir; ++i) {
			store[i] = P[i];
		}

		ind = 0;
		dt = P[0];
		for (j = 1; j <= ir; ++j) {
			phij = phi[j - 1];
			phijdt = phij * dt;
			ind2 = (j - 1) * (id2r2 - j) / 2;
			ind1 = j * (i45 - j) / 2;
			for (i = j; i <= ir; ++i) {
				ind++;
				ind2++;
				phii = phi[i - 1];
				P[ind2 - 1] = V[ind - 1] + phii * phijdt;
				if (j < ir) {
					P[ind2 - 1] += store[j] * phii;
				}
				if (i != ir) {
					ind1++;
					P[ind2 - 1] += store[i] * phij + P[ind1 - 1];
				}//500
			}
		}//500

		//Predict Y

		Y[l - 1] = A[0];
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				irj = ir + j;
				Y[l - 1] += A[irj - 1] * delta[j - 1];
			}
			//Calculate MSE of Y
		}//520
		AMS = P[0];
		if (id != 0) {
			for (j = 1; j <= id; ++j) {
				jrj = ibc + (j - 1) * (idd2 - j) / 2;
				irj = ir + j;
				AMS += (two * delta[j - 1] * P[irj - 1] + P[jrj] * delta[j - 1] * delta[j - 1]);
			}
			if (id != 1) {
				for (j = 1; j <= id1; ++j) {
					j1 = j + 1;
					jrk = ibc + 1 + (j - 1) * (idd2 - j) / 2;
					for (i = j1; i <= id; ++i) {
						jrk++;
						AMS += two * delta[i-1] * delta[j-1] * P[jrk-1];
					}
				}
			}//550
		}//550
		AMSE[l - 1] = AMS * sigma;

	}//560
	/*
	mdisplay(A, 1, ird);
	mdisplay(P, 1, irz);
	mdisplay(V, 1, np);
	mdisplay(store, 1, ird);
	mdisplay(xrow, 1, np);
	*/
	free(A);
	free(P);
	free(V);
	free(store);
	free(xrow);
	return ifault;
}